

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging_tests.c
# Opt level: O0

void failure_reported_and_exception_thrown_when_messaging_would_block(void)

{
  long lVar1;
  undefined8 uVar2;
  char panic_message [1000];
  int loop;
  int messaging;
  int LOOPS;
  undefined1 local_3f8 [1004];
  int local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_4 = 0x10001;
  local_8 = start_cgreen_messaging(0x21);
  signal_received = 0;
  __sysv_signal(0xd,catch_signal);
  panic_set_output_buffer(local_3f8);
  local_c = 0;
  while ((local_c < 0x10001 && (send_cgreen_message(local_8,99), signal_received != 1))) {
    local_c = local_c + 1;
  }
  lVar1 = (long)signal_received;
  uVar2 = create_equal_to_value_constraint(1,"1");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
               ,0x3c,"signal_received",lVar1,uVar2);
  lVar1 = (long)local_c;
  uVar2 = create_less_than_value_constraint(0x10001,"LOOPS");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
               ,0x3d,"loop",lVar1,uVar2);
  uVar2 = create_contains_string_constraint("Too many assertions","\"Too many assertions\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
               ,0x3e,"panic_message",local_3f8,uVar2);
  return;
}

Assistant:

Ensure(failure_reported_and_exception_thrown_when_messaging_would_block) {
    const int LOOPS = 65537;
    int messaging = start_cgreen_messaging(33);
    int loop;
    char panic_message[1000];

    signal_received = 0;
    signal(SIGPIPE, catch_signal);

    panic_set_output_buffer(panic_message);

    for (loop = 0; loop < LOOPS; loop++) {
        send_cgreen_message(messaging, 99);
        if (signal_received == 1)
            break;
    }

    assert_that(signal_received, is_equal_to(1));
    assert_that(loop, is_less_than(LOOPS));
    assert_that(panic_message, contains_string("Too many assertions"));
}